

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall
spoa::Graph::AddAlignment
          (Graph *this,Alignment *alignment,char *sequence,uint32_t sequence_len,char *quality,
          uint32_t quality_len)

{
  ulong uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> weights;
  int local_5c;
  Alignment *local_58;
  char *local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = alignment;
  local_50 = sequence;
  for (uVar1 = 0; quality_len != uVar1; uVar1 = uVar1 + 1) {
    local_5c = quality[uVar1] + -0x21;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_5c);
  }
  AddAlignment(this,local_58,local_50,sequence_len,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void Graph::AddAlignment(
    const Alignment& alignment,
    const char* sequence, std::uint32_t sequence_len,
    const char* quality, std::uint32_t quality_len) {
  std::vector<std::uint32_t> weights;
  for (std::uint32_t i = 0; i < quality_len; ++i) {
    weights.emplace_back(quality[i] - 33);  // Phred quality
  }
  AddAlignment(alignment, sequence, sequence_len, weights);
}